

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Huffman.cpp
# Opt level: O2

void __thiscall HuffmanDecoder::run(HuffmanDecoder *this)

{
  string *psVar1;
  list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_> *this_00;
  element_type *peVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ostream *poVar6;
  mapped_type *pmVar7;
  long lVar8;
  HuffmanNode *pHVar9;
  _Base_ptr p_Var10;
  __shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  size_type sVar12;
  value_type root;
  shared_ptr<HuffmanNode> parent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_freq;
  __shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> local_238;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> symbols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s_amount;
  string local_1d8 [32];
  stringstream output;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b0;
  ostream local_1a8 [376];
  
  poVar6 = std::operator<<((ostream *)&std::cout,"Huffman decryption...");
  std::endl<char,std::char_traits<char>>(poVar6);
  psVar1 = &(this->super_Cryptor).in_message_;
  std::__cxx11::string::string((string *)&output,(string *)psVar1);
  std::__cxx11::string::substr((ulong)&s_amount,(ulong)&output);
  std::__cxx11::string::~string((string *)&output);
  iVar3 = std::__cxx11::stoi(&s_amount,(size_t *)0x0,2);
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbols._M_t._M_impl.super__Rb_tree_header._M_header;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbols._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (lVar8 = 0; lVar8 < iVar3 * 2; lVar8 = lVar8 + 2) {
    std::__cxx11::string::string((string *)&s_freq,(string *)psVar1);
    std::__cxx11::string::substr((ulong)&output,(ulong)&s_freq);
    std::__cxx11::string::~string((string *)&s_freq);
    std::__cxx11::string::string((string *)&parent,(string *)psVar1);
    std::__cxx11::string::substr((ulong)&s_freq,(ulong)&parent);
    std::__cxx11::string::~string((string *)&parent);
    iVar4 = std::__cxx11::stoi(&s_freq,(size_t *)0x0,2);
    iVar5 = std::__cxx11::stoi((string *)&output,(size_t *)0x0,2);
    parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
         (undefined1)iVar5;
    pmVar7 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](&symbols,(key_type *)&parent);
    *pmVar7 = iVar4;
    std::__cxx11::string::~string((string *)&s_freq);
    std::__cxx11::string::~string((string *)&output);
  }
  this_00 = &this->nodes_;
  for (p_Var10 = symbols._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var10 != &symbols._M_t._M_impl.super__Rb_tree_header;
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
    pHVar9 = (HuffmanNode *)operator_new(0x28);
    iVar3 = *(int *)&p_Var10[1].field_0x4;
    pHVar9->c_ = (char)p_Var10[1]._M_color;
    pHVar9->n_ = iVar3;
    (pHVar9->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pHVar9->left_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pHVar9->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pHVar9->right_).super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HuffmanNode,void>
              ((__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2> *)&output,pHVar9);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(this_00,(value_type *)&output);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  }
  while (1 < (this->nodes_).
             super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
             ._M_impl._M_node._M_size) {
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::sort<HuffmanComparator>(this_00);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)&output,
               (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_00);
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)&s_freq,
               (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
               ((this_00->
                super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                )._M_impl._M_node.super__List_node_base._M_next + 1));
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::pop_front(this_00);
    pHVar9 = (HuffmanNode *)operator_new(0x28);
    HuffmanNode::HuffmanNode
              (pHVar9,(shared_ptr<HuffmanNode> *)&output,(shared_ptr<HuffmanNode> *)&s_freq);
    std::__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<HuffmanNode,void>
              ((__shared_ptr<HuffmanNode,(__gnu_cxx::_Lock_policy)2> *)&parent,pHVar9);
    std::__cxx11::list<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
    ::push_back(this_00,(value_type *)&parent);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&s_freq._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1b0);
  }
  std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
             ((this_00->
              super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
              )._M_impl._M_node.super__List_node_base._M_next + 1));
  std::__cxx11::stringstream::stringstream((stringstream *)&output);
  std::__cxx11::string::string((string *)&parent,(string *)psVar1);
  std::__cxx11::string::substr((ulong)&s_freq,(ulong)&parent);
  std::__cxx11::string::~string
            ((string *)&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
  sVar12 = 0;
  do {
    if (s_freq._M_string_length == sVar12) {
      std::__cxx11::string::~string((string *)&s_freq);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)&(this->super_Cryptor).out_message_,local_1d8);
      std::__cxx11::string::~string(local_1d8);
      poVar6 = std::operator<<((ostream *)&std::cout,"decryption done!");
      std::endl<char,std::char_traits<char>>(poVar6);
      std::__cxx11::stringstream::~stringstream((stringstream *)&output);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
      ::~_Rb_tree(&symbols._M_t);
      std::__cxx11::string::~string((string *)&s_amount);
      return;
    }
    if (s_freq._M_dataplus._M_p[sVar12] == '1') {
      p_Var11 = &((root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_)
                 .super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>;
LAB_00107e34:
      std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,p_Var11);
      std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
                 &parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    else if (s_freq._M_dataplus._M_p[sVar12] == '0') {
      p_Var11 = &((root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_).
                 super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>;
      goto LAB_00107e34;
    }
    std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
               &((root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->right_).
                super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
    if (CONCAT71(parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_,
                 parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_) ==
        0) {
      std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_238,
                 &((root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->left_)
                  .super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>);
      peVar2 = local_238._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_238._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      if (peVar2 == (element_type *)0x0) {
        std::operator<<(local_1a8,
                        (root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                        c_);
        std::ostream::flush();
        std::__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&root.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2> *)
                   ((this_00->
                    super__List_base<std::shared_ptr<HuffmanNode>,_std::allocator<std::shared_ptr<HuffmanNode>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next + 1));
      }
    }
    else {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&parent.super___shared_ptr<HuffmanNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    sVar12 = sVar12 + 1;
  } while( true );
}

Assistant:

void HuffmanDecoder::run() {
  cout << "Huffman decryption..." << endl;

  const auto s_amount = get_in_message().substr(0, 8);
  const auto amount = stoi(s_amount, nullptr, 2);
  map<char, int> symbols;
  for (auto i = 0; i < amount * 2; i += 2) {
    const auto char_index = 8 * (i + 1);
    const auto freq_index = 8 * (i + 2);
    auto s_char = get_in_message().substr(static_cast<unsigned long>(char_index), 8);
    auto s_freq = get_in_message().substr(static_cast<unsigned long>(freq_index), 8);
    symbols[stoi(s_char, nullptr, 2)] = stoi(s_freq, nullptr, 2);
  }

  for (auto& symbol : symbols) {
    shared_ptr<HuffmanNode> node(new HuffmanNode(symbol.first, symbol.second));
    nodes_.push_back(node);
  }

  //building the tree
  while (nodes_.size() > 1) {
    nodes_.sort(HuffmanComparator());

    auto left_son = nodes_.front();
    nodes_.pop_front();
    auto right_son = nodes_.front();
    nodes_.pop_front();

    shared_ptr<HuffmanNode> parent(new HuffmanNode(left_son, right_son));
    nodes_.push_back(parent);
  }

  auto root = nodes_.front();

  stringstream output;
  //saving decoded message
  for (auto& c : get_in_message().substr(static_cast<unsigned long>(amount * 16 + 8))) {
    if (c == '0') {
      root = root->get_left();
    }
    else if (c == '1') {
      root = root->get_right();
    }

    if (root->get_right() == nullptr &&
      root->get_left() == nullptr) {
      output << root->get_c() << flush;
      root = nodes_.front();
    }
  }
  set_out_message(output.str());

  cout << "decryption done!" << endl;
}